

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O3

void Cmd_morphme(FCommandLine *argv,APlayerPawn *who,int key)

{
  bool bVar1;
  int iVar2;
  char *it;
  
  bVar1 = CheckCheatmode(true);
  if (bVar1) {
    return;
  }
  iVar2 = FCommandLine::argc(argv);
  if (iVar2 == 1) {
    Net_WriteByte('\n');
    Net_WriteByte('\x16');
    return;
  }
  Net_WriteByte('+');
  it = FCommandLine::operator[](argv,1);
  Net_WriteString(it);
  return;
}

Assistant:

CCMD (morphme)
{
	if (CheckCheatmode ())
		return;

	if (argv.argc() == 1)
	{
		Net_WriteByte (DEM_GENERICCHEAT);
		Net_WriteByte (CHT_MORPH);
	}
	else
	{
		Net_WriteByte (DEM_MORPHEX);
		Net_WriteString (argv[1]);
	}
}